

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void http_connect(curl_socket_t *infdp,curl_socket_t rootfd,char *ipaddr,unsigned_short ipport)

{
  byte bVar1;
  bool bVar2;
  _Bool _Var3;
  curl_socket_t cVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  size_t len;
  curl_socklen_t flag;
  int err;
  httprequest req2;
  curl_socket_t datafd;
  _Bool tcp_fin_wr;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  curl_socket_t maxfd;
  ssize_t rc;
  timeval timeout;
  fd_set output;
  fd_set input;
  int local_470;
  int timeout_count;
  int i;
  int loop;
  int max_tunnel_idx;
  undefined2 local_45c;
  _Bool secondary;
  _Bool primary;
  _Bool poll_server_wr [2];
  _Bool poll_client_wr [2];
  _Bool poll_server_rd [2];
  _Bool poll_client_rd [2];
  char readserver [2] [256];
  char readclient [2] [256];
  ssize_t tos [2];
  ssize_t toc [2];
  int iStack_30;
  curl_socket_t clientfd [2];
  curl_socket_t serverfd [2];
  unsigned_short ipport_local;
  char *ipaddr_local;
  curl_socket_t rootfd_local;
  curl_socket_t *infdp_local;
  
  clientfd[0] = -1;
  clientfd[1] = -1;
  stack0xffffffffffffffcc = 0xffffffffffffffff;
  memset(tos + 1,0,0x10);
  memset(readclient[1] + 0xf8,0,0x10);
  _secondary = 0x101;
  local_45c = 0x101;
  max_tunnel_idx._2_2_ = 0x101;
  max_tunnel_idx._0_2_ = 0x101;
  bVar1 = 0;
  input.__fds_bits[0xf]._4_4_ = 0;
  stack0xffffffffffffffcc = CONCAT44(iStack_30,*infdp);
  for (timeout_count = 2; 0 < timeout_count && got_exit_signal == 0;
      timeout_count = timeout_count + -1) {
    wait_ms(0xfa);
  }
  if (got_exit_signal == 0) {
    cVar4 = connect_to(ipaddr,ipport);
    clientfd[0] = cVar4;
    if (cVar4 != -1) {
      i = 0;
      bVar2 = true;
      do {
        while( true ) {
          if (got_exit_signal != 0) goto LAB_0010b1b3;
          rc = 1;
          timeout.tv_sec = 0;
          __arr._4_4_ = -1;
          for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
            output.__fds_bits[(ulong)(uint)__arr + 0xf] = 0;
          }
          for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
            output.__fds_bits[(ulong)__arr_1._4_4_ - 1] = 0;
          }
          if (((((iStack_30 == -1) && (clientfd[1] == -1)) && ((_secondary & 1) != 0)) &&
              (((max_tunnel_idx._2_2_ & 1) != 0 && ((local_45c & 1) != 0)))) &&
             (((ushort)max_tunnel_idx & 1) != 0)) {
            output.__fds_bits[(long)(rootfd / 0x40) + 0xf] =
                 1L << ((byte)((long)rootfd % 0x40) & 0x3f) |
                 output.__fds_bits[(long)(rootfd / 0x40) + 0xf];
            __arr._4_4_ = rootfd;
          }
          for (local_470 = 0; local_470 <= i; local_470 = local_470 + 1) {
            if (*(int *)((long)toc + (long)local_470 * 4 + 0xc) != -1) {
              if ((((&secondary)[local_470] & 1U) != 0) &&
                 (lVar6 = (long)(*(int *)((long)toc + (long)local_470 * 4 + 0xc) / 0x40),
                 output.__fds_bits[lVar6 + 0xf] =
                      1L << ((byte)((long)*(int *)((long)toc + (long)local_470 * 4 + 0xc) % 0x40) &
                            0x3f) | output.__fds_bits[lVar6 + 0xf],
                 __arr._4_4_ < *(int *)((long)toc + (long)local_470 * 4 + 0xc))) {
                __arr._4_4_ = *(int *)((long)toc + (long)local_470 * 4 + 0xc);
              }
              if ((((*(byte *)((long)&max_tunnel_idx + (long)local_470 + 2) & 1) != 0) &&
                  (tos[(long)local_470 + 1] != 0)) &&
                 (lVar6 = (long)(*(int *)((long)toc + (long)local_470 * 4 + 0xc) / 0x40),
                 output.__fds_bits[lVar6 + -1] =
                      1L << ((byte)((long)*(int *)((long)toc + (long)local_470 * 4 + 0xc) % 0x40) &
                            0x3f) | output.__fds_bits[lVar6 + -1],
                 __arr._4_4_ < *(int *)((long)toc + (long)local_470 * 4 + 0xc))) {
                __arr._4_4_ = *(int *)((long)toc + (long)local_470 * 4 + 0xc);
              }
            }
            if (clientfd[local_470] != -1) {
              if (((*(byte *)((long)&local_45c + (long)local_470) & 1) != 0) &&
                 (output.__fds_bits[(long)(clientfd[local_470] / 0x40) + 0xf] =
                       1L << ((byte)((long)clientfd[local_470] % 0x40) & 0x3f) |
                       output.__fds_bits[(long)(clientfd[local_470] / 0x40) + 0xf],
                 __arr._4_4_ < clientfd[local_470])) {
                __arr._4_4_ = clientfd[local_470];
              }
              if ((((*(byte *)((long)&max_tunnel_idx + (long)local_470) & 1) != 0) &&
                  (tos[(long)local_470 + -1] != 0)) &&
                 (output.__fds_bits[(long)(clientfd[local_470] / 0x40) + -1] =
                       1L << ((byte)((long)clientfd[local_470] % 0x40) & 0x3f) |
                       output.__fds_bits[(long)(clientfd[local_470] / 0x40) + -1],
                 __arr._4_4_ < clientfd[local_470])) {
                __arr._4_4_ = clientfd[local_470];
              }
            }
          }
          do {
            iVar5 = select(__arr._4_4_ + 1,(fd_set *)(output.__fds_bits + 0xf),
                           (fd_set *)&timeout.tv_usec,(fd_set *)0x0,(timeval *)&rc);
            bVar11 = false;
            if (iVar5 < 0) {
              piVar7 = __errno_location();
              bVar11 = false;
              if (*piVar7 == 4) {
                bVar11 = got_exit_signal == 0;
              }
            }
          } while (bVar11);
          if (got_exit_signal != 0) goto LAB_0010b1b3;
          if (iVar5 < 1) break;
          bVar11 = false;
          input.__fds_bits[0xf]._4_4_ = 0;
          if (((iStack_30 == -1) && (clientfd[1] == -1)) &&
             ((output.__fds_bits[(long)(rootfd / 0x40) + 0xf] &
              1L << ((byte)((long)rootfd % 0x40) & 0x3f)) != 0)) {
            req2._150080_4_ = accept(rootfd,(sockaddr *)0x0,(socklen_t *)0x0);
            if (req2._150080_4_ != -1) {
              len._4_4_ = 0;
              memset(&flag,0,0x24a48);
              logmsg("====> Client connect DATA");
              _Var3 = socket_domain_is_ip();
              if (_Var3) {
                len._0_4_ = 1;
                iVar5 = setsockopt(req2._150080_4_,6,1,&len,4);
                if (iVar5 != 0) {
                  logmsg("====> TCP_NODELAY for client DATA connection failed");
                }
              }
              init_httprequest((httprequest *)&flag);
              do {
                if (req2.callcount != 0) break;
                len._4_4_ = get_request(req2._150080_4_,(httprequest *)&flag);
              } while (-1 < len._4_4_);
              if (((-1 < len._4_4_) &&
                  (len._4_4_ = send_doc(req2._150080_4_,(httprequest *)&flag), len._4_4_ == 0)) &&
                 ((req2.reqbuf[0x249e8] & 1U) != 0)) {
                for (timeout_count = 2; 0 < timeout_count && got_exit_signal == 0;
                    timeout_count = timeout_count + -1) {
                  wait_ms(0xfa);
                }
                if (got_exit_signal == 0) {
                  cVar4 = connect_to(ipaddr,req2.reqbuf._149994_2_);
                  clientfd[1] = cVar4;
                  if (cVar4 != -1) {
                    _secondary = CONCAT11(1,secondary);
                    max_tunnel_idx._2_2_ = CONCAT11(1,max_tunnel_idx._2_1_);
                    local_45c = CONCAT11(1,(undefined1)local_45c);
                    max_tunnel_idx._0_2_ = CONCAT11(1,(undefined1)max_tunnel_idx);
                    i = 1;
                    bVar1 = 1;
                    toc[0] = 0;
                    tos[0] = 0;
                    stack0xffffffffffffffcc = CONCAT44(req2._150080_4_,toc[1]._4_4_);
                    req2.connmon = true;
                    req2.upgrade = true;
                    req2.upgrade_request = true;
                    req2.close = true;
                  }
                }
              }
              if (req2._150080_4_ != -1) {
                shutdown(req2._150080_4_,2);
                close(req2._150080_4_);
              }
            }
            if (got_exit_signal != 0) goto LAB_0010b1b3;
          }
          for (local_470 = 0; local_470 <= i; local_470 = local_470 + 1) {
            if (((*(int *)((long)toc + (long)local_470 * 4 + 0xc) != -1) &&
                (0x100U - tos[(long)local_470 + -1] != 0)) &&
               ((output.__fds_bits
                 [(long)(*(int *)((long)toc + (long)local_470 * 4 + 0xc) / 0x40) + 0xf] &
                1L << ((byte)((long)*(int *)((long)toc + (long)local_470 * 4 + 0xc) % 0x40) & 0x3f))
                != 0)) {
              sVar8 = recv(*(int *)((long)toc + (long)local_470 * 4 + 0xc),
                           readserver[(long)local_470 + 1] + tos[(long)local_470 + -1] + 0xf8,
                           0x100U - tos[(long)local_470 + -1],0);
              if ((long)sVar8 < 1) {
                pcVar10 = "CTRL";
                if (local_470 != 0) {
                  pcVar10 = "DATA";
                }
                logmsg("[%s] got %zd, STOP READING client",pcVar10,sVar8);
                shutdown(*(int *)((long)toc + (long)local_470 * 4 + 0xc),0);
                (&secondary)[local_470] = false;
              }
              else {
                pcVar10 = "CTRL";
                if (local_470 != 0) {
                  pcVar10 = "DATA";
                }
                logmsg("[%s] READ %zd bytes from client",pcVar10,sVar8);
                pcVar10 = "CTRL";
                if (local_470 != 0) {
                  pcVar10 = "DATA";
                }
                pcVar9 = data_to_hex(readserver[(long)local_470 + 1] +
                                     tos[(long)local_470 + -1] + 0xf8,sVar8);
                logmsg("[%s] READ \"%s\"",pcVar10,pcVar9);
                tos[(long)local_470 + -1] = sVar8 + tos[(long)local_470 + -1];
              }
            }
            if (((clientfd[local_470] != -1) && (0x100U - tos[(long)local_470 + 1] != 0)) &&
               ((output.__fds_bits[(long)(clientfd[local_470] / 0x40) + 0xf] &
                1L << ((byte)((long)clientfd[local_470] % 0x40) & 0x3f)) != 0)) {
              sVar8 = recv(clientfd[local_470],
                           poll_server_wr + tos[(long)local_470 + 1] + (long)local_470 * 0x100,
                           0x100U - tos[(long)local_470 + 1],0);
              if ((long)sVar8 < 1) {
                pcVar10 = "CTRL";
                if (local_470 != 0) {
                  pcVar10 = "DATA";
                }
                logmsg("[%s] got %zd, STOP READING server",pcVar10,sVar8);
                shutdown(clientfd[local_470],0);
                *(undefined1 *)((long)&local_45c + (long)local_470) = 0;
              }
              else {
                pcVar10 = "CTRL";
                if (local_470 != 0) {
                  pcVar10 = "DATA";
                }
                logmsg("[%s] READ %zd bytes from server",pcVar10,sVar8);
                pcVar10 = "CTRL";
                if (local_470 != 0) {
                  pcVar10 = "DATA";
                }
                pcVar9 = data_to_hex(poll_server_wr +
                                     tos[(long)local_470 + 1] + (long)local_470 * 0x100,sVar8);
                logmsg("[%s] READ \"%s\"",pcVar10,pcVar9);
                tos[(long)local_470 + 1] = sVar8 + tos[(long)local_470 + 1];
              }
            }
            if (((*(int *)((long)toc + (long)local_470 * 4 + 0xc) != -1) &&
                (tos[(long)local_470 + 1] != 0)) &&
               ((output.__fds_bits
                 [(long)(*(int *)((long)toc + (long)local_470 * 4 + 0xc) / 0x40) + -1] &
                1L << ((byte)((long)*(int *)((long)toc + (long)local_470 * 4 + 0xc) % 0x40) & 0x3f))
                != 0)) {
              sVar8 = send(*(int *)((long)toc + (long)local_470 * 4 + 0xc),
                           poll_server_wr + (long)local_470 * 0x100,tos[(long)local_470 + 1],0x4000)
              ;
              if ((long)sVar8 < 1) {
                pcVar10 = "CTRL";
                if (local_470 != 0) {
                  pcVar10 = "DATA";
                }
                logmsg("[%s] got %zd, STOP WRITING client",pcVar10,sVar8);
                shutdown(*(int *)((long)toc + (long)local_470 * 4 + 0xc),1);
                *(undefined1 *)((long)&max_tunnel_idx + (long)local_470 + 2) = 0;
                bVar11 = true;
              }
              else {
                pcVar10 = "CTRL";
                if (local_470 != 0) {
                  pcVar10 = "DATA";
                }
                logmsg("[%s] SENT %zd bytes to client",pcVar10,sVar8);
                pcVar10 = "CTRL";
                if (local_470 != 0) {
                  pcVar10 = "DATA";
                }
                pcVar9 = data_to_hex(poll_server_wr + (long)local_470 * 0x100,sVar8);
                logmsg("[%s] SENT \"%s\"",pcVar10,pcVar9);
                if (tos[(long)local_470 + 1] != sVar8) {
                  memmove(poll_server_wr + (long)local_470 * 0x100,
                          poll_server_wr + sVar8 + (long)local_470 * 0x100,
                          tos[(long)local_470 + 1] - sVar8);
                }
                tos[(long)local_470 + 1] = tos[(long)local_470 + 1] - sVar8;
              }
            }
            if (((clientfd[local_470] != -1) && (tos[(long)local_470 + -1] != 0)) &&
               ((output.__fds_bits[(long)(clientfd[local_470] / 0x40) + -1] &
                1L << ((byte)((long)clientfd[local_470] % 0x40) & 0x3f)) != 0)) {
              sVar8 = send(clientfd[local_470],readserver[(long)local_470 + 1] + 0xf8,
                           tos[(long)local_470 + -1],0x4000);
              if ((long)sVar8 < 1) {
                pcVar10 = "CTRL";
                if (local_470 != 0) {
                  pcVar10 = "DATA";
                }
                logmsg("[%s] got %zd, STOP WRITING server",pcVar10,sVar8);
                shutdown(clientfd[local_470],1);
                *(undefined1 *)((long)&max_tunnel_idx + (long)local_470) = 0;
                bVar11 = true;
              }
              else {
                pcVar10 = "CTRL";
                if (local_470 != 0) {
                  pcVar10 = "DATA";
                }
                logmsg("[%s] SENT %zd bytes to server",pcVar10,sVar8);
                pcVar10 = "CTRL";
                if (local_470 != 0) {
                  pcVar10 = "DATA";
                }
                pcVar9 = data_to_hex(readserver[(long)local_470 + 1] + 0xf8,sVar8);
                logmsg("[%s] SENT \"%s\"",pcVar10,pcVar9);
                if (tos[(long)local_470 + -1] != sVar8) {
                  memmove(readserver[(long)local_470 + 1] + 0xf8,
                          readserver[(long)local_470 + 1] + sVar8 + 0xf8,
                          tos[(long)local_470 + -1] - sVar8);
                }
                tos[(long)local_470 + -1] = tos[(long)local_470 + -1] - sVar8;
              }
            }
          }
          if (got_exit_signal != 0) goto LAB_0010b1b3;
          for (local_470 = 0; local_470 <= i; local_470 = local_470 + 1) {
            for (timeout_count = 2; 0 < timeout_count; timeout_count = timeout_count + -1) {
              if (*(int *)((long)toc + (long)local_470 * 4 + 0xc) != -1) {
                if ((((&secondary)[local_470] & 1U) != 0) &&
                   ((*(byte *)((long)&max_tunnel_idx + (long)local_470) & 1) == 0)) {
                  logmsg("[%s] DISABLED READING client");
                  shutdown(*(int *)((long)toc + (long)local_470 * 4 + 0xc),0);
                  (&secondary)[local_470] = false;
                }
                if ((((*(byte *)((long)&max_tunnel_idx + (long)local_470 + 2) & 1) != 0) &&
                    ((*(byte *)((long)&local_45c + (long)local_470) & 1) == 0)) &&
                   (tos[(long)local_470 + 1] == 0)) {
                  pcVar10 = "CTRL";
                  if (local_470 != 0) {
                    pcVar10 = "DATA";
                  }
                  logmsg("[%s] DISABLED WRITING client",pcVar10);
                  shutdown(*(int *)((long)toc + (long)local_470 * 4 + 0xc),1);
                  *(undefined1 *)((long)&max_tunnel_idx + (long)local_470 + 2) = 0;
                  bVar11 = true;
                }
              }
              if (clientfd[local_470] != -1) {
                if (((*(byte *)((long)&local_45c + (long)local_470) & 1) != 0) &&
                   ((*(byte *)((long)&max_tunnel_idx + (long)local_470 + 2) & 1) == 0)) {
                  logmsg("[%s] DISABLED READING server");
                  shutdown(clientfd[local_470],0);
                  *(undefined1 *)((long)&local_45c + (long)local_470) = 0;
                }
                if ((((*(byte *)((long)&max_tunnel_idx + (long)local_470) & 1) != 0) &&
                    (((&secondary)[local_470] & 1U) == 0)) && (tos[(long)local_470 + -1] == 0)) {
                  pcVar10 = "CTRL";
                  if (local_470 != 0) {
                    pcVar10 = "DATA";
                  }
                  logmsg("[%s] DISABLED WRITING server",pcVar10);
                  shutdown(clientfd[local_470],1);
                  *(undefined1 *)((long)&max_tunnel_idx + (long)local_470) = 0;
                  bVar11 = true;
                }
              }
            }
          }
          if (bVar11) {
            wait_ms(0xfa);
          }
          for (local_470 = 0; local_470 <= i; local_470 = local_470 + 1) {
            for (timeout_count = 2; 0 < timeout_count; timeout_count = timeout_count + -1) {
              if (((*(int *)((long)toc + (long)local_470 * 4 + 0xc) != -1) &&
                  ((*(byte *)((long)&max_tunnel_idx + (long)local_470 + 2) & 1) == 0)) &&
                 (((&secondary)[local_470] & 1U) == 0)) {
                pcVar10 = "CTRL";
                if (local_470 != 0) {
                  pcVar10 = "DATA";
                }
                logmsg("[%s] CLOSING client socket",pcVar10);
                close(*(int *)((long)toc + (long)local_470 * 4 + 0xc));
                *(undefined4 *)((long)toc + (long)local_470 * 4 + 0xc) = 0xffffffff;
                if (clientfd[local_470] == -1) {
                  pcVar10 = "CTRL";
                  if (local_470 != 0) {
                    pcVar10 = "DATA";
                  }
                  logmsg("[%s] ENDING",pcVar10);
                  if (local_470 == 1) {
                    bVar1 = 0;
                  }
                  else {
                    bVar2 = false;
                  }
                }
              }
              if (((clientfd[local_470] != -1) &&
                  ((*(byte *)((long)&max_tunnel_idx + (long)local_470) & 1) == 0)) &&
                 ((*(byte *)((long)&local_45c + (long)local_470) & 1) == 0)) {
                pcVar10 = "CTRL";
                if (local_470 != 0) {
                  pcVar10 = "DATA";
                }
                logmsg("[%s] CLOSING server socket",pcVar10);
                close(clientfd[local_470]);
                clientfd[local_470] = -1;
                if (*(int *)((long)toc + (long)local_470 * 4 + 0xc) == -1) {
                  pcVar10 = "CTRL";
                  if (local_470 != 0) {
                    pcVar10 = "DATA";
                  }
                  logmsg("[%s] ENDING",pcVar10);
                  if (local_470 == 1) {
                    bVar1 = 0;
                  }
                  else {
                    bVar2 = false;
                  }
                }
              }
            }
          }
          i = (int)bVar1;
          if (!bVar2) goto LAB_0010b1b3;
        }
        input.__fds_bits[0xf]._4_4_ = input.__fds_bits[0xf]._4_4_ + 1;
      } while ((int)input.__fds_bits[0xf]._4_4_ < 6);
      logmsg("CONNECT proxy timeout after %d idle seconds!",(ulong)input.__fds_bits[0xf]._4_4_);
    }
  }
LAB_0010b1b3:
  for (local_470 = 1; -1 < local_470; local_470 = local_470 + -1) {
    if (clientfd[local_470] != -1) {
      pcVar10 = "CTRL";
      if (local_470 != 0) {
        pcVar10 = "DATA";
      }
      logmsg("[%s] CLOSING server socket (cleanup)",pcVar10);
      shutdown(clientfd[local_470],2);
      close(clientfd[local_470]);
    }
    if (*(int *)((long)toc + (long)local_470 * 4 + 0xc) != -1) {
      pcVar10 = "CTRL";
      if (local_470 != 0) {
        pcVar10 = "DATA";
      }
      logmsg("[%s] CLOSING client socket (cleanup)",pcVar10);
      shutdown(*(int *)((long)toc + (long)local_470 * 4 + 0xc),2);
      close(*(int *)((long)toc + (long)local_470 * 4 + 0xc));
    }
    if ((clientfd[local_470] != -1) || (*(int *)((long)toc + (long)local_470 * 4 + 0xc) != -1)) {
      pcVar10 = "CTRL";
      if (local_470 != 0) {
        pcVar10 = "DATA";
      }
      logmsg("[%s] ABORTING",pcVar10);
    }
  }
  *infdp = -1;
  return;
}

Assistant:

static void http_connect(curl_socket_t *infdp,
                         curl_socket_t rootfd,
                         const char *ipaddr,
                         unsigned short ipport)
{
  curl_socket_t serverfd[2] = {CURL_SOCKET_BAD, CURL_SOCKET_BAD};
  curl_socket_t clientfd[2] = {CURL_SOCKET_BAD, CURL_SOCKET_BAD};
  ssize_t toc[2] = {0, 0}; /* number of bytes to client */
  ssize_t tos[2] = {0, 0}; /* number of bytes to server */
  char readclient[2][256];
  char readserver[2][256];
  bool poll_client_rd[2] = { TRUE, TRUE };
  bool poll_server_rd[2] = { TRUE, TRUE };
  bool poll_client_wr[2] = { TRUE, TRUE };
  bool poll_server_wr[2] = { TRUE, TRUE };
  bool primary = FALSE;
  bool secondary = FALSE;
  int max_tunnel_idx; /* CTRL or DATA */
  int loop;
  int i;
  int timeout_count = 0;

  /* primary tunnel client endpoint already connected */
  clientfd[CTRL] = *infdp;

  /* Sleep here to make sure the client reads CONNECT response's
     'end of headers' separate from the server data that follows.
     This is done to prevent triggering libcurl known bug #39. */
  for(loop = 2; (loop > 0) && !got_exit_signal; loop--)
    wait_ms(250);
  if(got_exit_signal)
    goto http_connect_cleanup;

  serverfd[CTRL] = connect_to(ipaddr, ipport);
  if(serverfd[CTRL] == CURL_SOCKET_BAD)
    goto http_connect_cleanup;

  /* Primary tunnel socket endpoints are now connected. Tunnel data back and
     forth over the primary tunnel until client or server breaks the primary
     tunnel, simultaneously allowing establishment, operation and teardown of
     a secondary tunnel that may be used for passive FTP data connection. */

  max_tunnel_idx = CTRL;
  primary = TRUE;

  while(!got_exit_signal) {

    fd_set input;
    fd_set output;
    struct timeval timeout = {1, 0}; /* 1000 ms */
    ssize_t rc;
    curl_socket_t maxfd = (curl_socket_t)-1;

    FD_ZERO(&input);
    FD_ZERO(&output);

    if((clientfd[DATA] == CURL_SOCKET_BAD) &&
       (serverfd[DATA] == CURL_SOCKET_BAD) &&
       poll_client_rd[CTRL] && poll_client_wr[CTRL] &&
       poll_server_rd[CTRL] && poll_server_wr[CTRL]) {
      /* listener socket is monitored to allow client to establish
         secondary tunnel only when this tunnel is not established
         and primary one is fully operational */
      FD_SET(rootfd, &input);
      maxfd = rootfd;
    }

    /* set tunnel sockets to wait for */
    for(i = 0; i <= max_tunnel_idx; i++) {
      /* client side socket monitoring */
      if(clientfd[i] != CURL_SOCKET_BAD) {
        if(poll_client_rd[i]) {
          /* unless told not to do so, monitor readability */
          FD_SET(clientfd[i], &input);
          if(clientfd[i] > maxfd)
            maxfd = clientfd[i];
        }
        if(poll_client_wr[i] && toc[i]) {
          /* unless told not to do so, monitor writability
             if there is data ready to be sent to client */
          FD_SET(clientfd[i], &output);
          if(clientfd[i] > maxfd)
            maxfd = clientfd[i];
        }
      }
      /* server side socket monitoring */
      if(serverfd[i] != CURL_SOCKET_BAD) {
        if(poll_server_rd[i]) {
          /* unless told not to do so, monitor readability */
          FD_SET(serverfd[i], &input);
          if(serverfd[i] > maxfd)
            maxfd = serverfd[i];
        }
        if(poll_server_wr[i] && tos[i]) {
          /* unless told not to do so, monitor writability
             if there is data ready to be sent to server */
          FD_SET(serverfd[i], &output);
          if(serverfd[i] > maxfd)
            maxfd = serverfd[i];
        }
      }
    }
    if(got_exit_signal)
      break;

    do {
      rc = select((int)maxfd + 1, &input, &output, NULL, &timeout);
    } while(rc < 0 && errno == EINTR && !got_exit_signal);

    if(got_exit_signal)
      break;

    if(rc > 0) {
      /* socket action */
      bool tcp_fin_wr = FALSE;
      timeout_count = 0;

      /* ---------------------------------------------------------- */

      /* passive mode FTP may establish a secondary tunnel */
      if((clientfd[DATA] == CURL_SOCKET_BAD) &&
         (serverfd[DATA] == CURL_SOCKET_BAD) && FD_ISSET(rootfd, &input)) {
        /* a new connection on listener socket (most likely from client) */
        curl_socket_t datafd = accept(rootfd, NULL, NULL);
        if(datafd != CURL_SOCKET_BAD) {
          struct httprequest req2;
          int err = 0;
          memset(&req2, 0, sizeof(req2));
          logmsg("====> Client connect DATA");
#ifdef TCP_NODELAY
          if(socket_domain_is_ip()) {
            /* Disable the Nagle algorithm */
            curl_socklen_t flag = 1;
            if(0 != setsockopt(datafd, IPPROTO_TCP, TCP_NODELAY,
                               (void *)&flag, sizeof(flag)))
              logmsg("====> TCP_NODELAY for client DATA connection failed");
          }
#endif
          init_httprequest(&req2);
          while(!req2.done_processing) {
            err = get_request(datafd, &req2);
            if(err < 0) {
              /* this socket must be closed, done or not */
              break;
            }
          }

          /* skip this and close the socket if err < 0 */
          if(err >= 0) {
            err = send_doc(datafd, &req2);
            if(!err && req2.connect_request) {
              /* sleep to prevent triggering libcurl known bug #39. */
              for(loop = 2; (loop > 0) && !got_exit_signal; loop--)
                wait_ms(250);
              if(!got_exit_signal) {
                /* connect to the server */
                serverfd[DATA] = connect_to(ipaddr, req2.connect_port);
                if(serverfd[DATA] != CURL_SOCKET_BAD) {
                  /* secondary tunnel established, now we have two
                     connections */
                  poll_client_rd[DATA] = TRUE;
                  poll_client_wr[DATA] = TRUE;
                  poll_server_rd[DATA] = TRUE;
                  poll_server_wr[DATA] = TRUE;
                  max_tunnel_idx = DATA;
                  secondary = TRUE;
                  toc[DATA] = 0;
                  tos[DATA] = 0;
                  clientfd[DATA] = datafd;
                  datafd = CURL_SOCKET_BAD;
                }
              }
            }
          }
          if(datafd != CURL_SOCKET_BAD) {
            /* secondary tunnel not established */
            shutdown(datafd, SHUT_RDWR);
            sclose(datafd);
          }
        }
        if(got_exit_signal)
          break;
      }

      /* ---------------------------------------------------------- */

      /* react to tunnel endpoint readable/writable notifications */
      for(i = 0; i <= max_tunnel_idx; i++) {
        size_t len;
        if(clientfd[i] != CURL_SOCKET_BAD) {
          len = sizeof(readclient[i]) - tos[i];
          if(len && FD_ISSET(clientfd[i], &input)) {
            /* read from client */
            rc = sread(clientfd[i], &readclient[i][tos[i]], len);
            if(rc <= 0) {
              logmsg("[%s] got %zd, STOP READING client", data_or_ctrl(i), rc);
              shutdown(clientfd[i], SHUT_RD);
              poll_client_rd[i] = FALSE;
            }
            else {
              logmsg("[%s] READ %zd bytes from client", data_or_ctrl(i), rc);
              logmsg("[%s] READ \"%s\"", data_or_ctrl(i),
                     data_to_hex(&readclient[i][tos[i]], rc));
              tos[i] += rc;
            }
          }
        }
        if(serverfd[i] != CURL_SOCKET_BAD) {
          len = sizeof(readserver[i])-toc[i];
          if(len && FD_ISSET(serverfd[i], &input)) {
            /* read from server */
            rc = sread(serverfd[i], &readserver[i][toc[i]], len);
            if(rc <= 0) {
              logmsg("[%s] got %zd, STOP READING server", data_or_ctrl(i), rc);
              shutdown(serverfd[i], SHUT_RD);
              poll_server_rd[i] = FALSE;
            }
            else {
              logmsg("[%s] READ %zd bytes from server", data_or_ctrl(i), rc);
              logmsg("[%s] READ \"%s\"", data_or_ctrl(i),
                     data_to_hex(&readserver[i][toc[i]], rc));
              toc[i] += rc;
            }
          }
        }
        if(clientfd[i] != CURL_SOCKET_BAD) {
          if(toc[i] && FD_ISSET(clientfd[i], &output)) {
            /* write to client */
            rc = swrite(clientfd[i], readserver[i], toc[i]);
            if(rc <= 0) {
              logmsg("[%s] got %zd, STOP WRITING client", data_or_ctrl(i), rc);
              shutdown(clientfd[i], SHUT_WR);
              poll_client_wr[i] = FALSE;
              tcp_fin_wr = TRUE;
            }
            else {
              logmsg("[%s] SENT %zd bytes to client", data_or_ctrl(i), rc);
              logmsg("[%s] SENT \"%s\"", data_or_ctrl(i),
                     data_to_hex(readserver[i], rc));
              if(toc[i] - rc)
                memmove(&readserver[i][0], &readserver[i][rc], toc[i]-rc);
              toc[i] -= rc;
            }
          }
        }
        if(serverfd[i] != CURL_SOCKET_BAD) {
          if(tos[i] && FD_ISSET(serverfd[i], &output)) {
            /* write to server */
            rc = swrite(serverfd[i], readclient[i], tos[i]);
            if(rc <= 0) {
              logmsg("[%s] got %zd, STOP WRITING server", data_or_ctrl(i), rc);
              shutdown(serverfd[i], SHUT_WR);
              poll_server_wr[i] = FALSE;
              tcp_fin_wr = TRUE;
            }
            else {
              logmsg("[%s] SENT %zd bytes to server", data_or_ctrl(i), rc);
              logmsg("[%s] SENT \"%s\"", data_or_ctrl(i),
                     data_to_hex(readclient[i], rc));
              if(tos[i] - rc)
                memmove(&readclient[i][0], &readclient[i][rc], tos[i]-rc);
              tos[i] -= rc;
            }
          }
        }
      }
      if(got_exit_signal)
        break;

      /* ---------------------------------------------------------- */

      /* endpoint read/write disabling, endpoint closing and tunnel teardown */
      for(i = 0; i <= max_tunnel_idx; i++) {
        for(loop = 2; loop > 0; loop--) {
          /* loop twice to satisfy condition interdependencies without
             having to await select timeout or another socket event */
          if(clientfd[i] != CURL_SOCKET_BAD) {
            if(poll_client_rd[i] && !poll_server_wr[i]) {
              logmsg("[%s] DISABLED READING client", data_or_ctrl(i));
              shutdown(clientfd[i], SHUT_RD);
              poll_client_rd[i] = FALSE;
            }
            if(poll_client_wr[i] && !poll_server_rd[i] && !toc[i]) {
              logmsg("[%s] DISABLED WRITING client", data_or_ctrl(i));
              shutdown(clientfd[i], SHUT_WR);
              poll_client_wr[i] = FALSE;
              tcp_fin_wr = TRUE;
            }
          }
          if(serverfd[i] != CURL_SOCKET_BAD) {
            if(poll_server_rd[i] && !poll_client_wr[i]) {
              logmsg("[%s] DISABLED READING server", data_or_ctrl(i));
              shutdown(serverfd[i], SHUT_RD);
              poll_server_rd[i] = FALSE;
            }
            if(poll_server_wr[i] && !poll_client_rd[i] && !tos[i]) {
              logmsg("[%s] DISABLED WRITING server", data_or_ctrl(i));
              shutdown(serverfd[i], SHUT_WR);
              poll_server_wr[i] = FALSE;
              tcp_fin_wr = TRUE;
            }
          }
        }
      }

      if(tcp_fin_wr)
        /* allow kernel to place FIN bit packet on the wire */
        wait_ms(250);

      /* socket clearing */
      for(i = 0; i <= max_tunnel_idx; i++) {
        for(loop = 2; loop > 0; loop--) {
          if(clientfd[i] != CURL_SOCKET_BAD) {
            if(!poll_client_wr[i] && !poll_client_rd[i]) {
              logmsg("[%s] CLOSING client socket", data_or_ctrl(i));
              sclose(clientfd[i]);
              clientfd[i] = CURL_SOCKET_BAD;
              if(serverfd[i] == CURL_SOCKET_BAD) {
                logmsg("[%s] ENDING", data_or_ctrl(i));
                if(i == DATA)
                  secondary = FALSE;
                else
                  primary = FALSE;
              }
            }
          }
          if(serverfd[i] != CURL_SOCKET_BAD) {
            if(!poll_server_wr[i] && !poll_server_rd[i]) {
              logmsg("[%s] CLOSING server socket", data_or_ctrl(i));
              sclose(serverfd[i]);
              serverfd[i] = CURL_SOCKET_BAD;
              if(clientfd[i] == CURL_SOCKET_BAD) {
                logmsg("[%s] ENDING", data_or_ctrl(i));
                if(i == DATA)
                  secondary = FALSE;
                else
                  primary = FALSE;
              }
            }
          }
        }
      }

      /* ---------------------------------------------------------- */

      max_tunnel_idx = secondary ? DATA : CTRL;

      if(!primary)
        /* exit loop upon primary tunnel teardown */
        break;

    } /* (rc > 0) */
    else {
      timeout_count++;
      if(timeout_count > 5) {
        logmsg("CONNECT proxy timeout after %d idle seconds!", timeout_count);
        break;
      }
    }
  }

http_connect_cleanup:

  for(i = DATA; i >= CTRL; i--) {
    if(serverfd[i] != CURL_SOCKET_BAD) {
      logmsg("[%s] CLOSING server socket (cleanup)", data_or_ctrl(i));
      shutdown(serverfd[i], SHUT_RDWR);
      sclose(serverfd[i]);
    }
    if(clientfd[i] != CURL_SOCKET_BAD) {
      logmsg("[%s] CLOSING client socket (cleanup)", data_or_ctrl(i));
      shutdown(clientfd[i], SHUT_RDWR);
      sclose(clientfd[i]);
    }
    if((serverfd[i] != CURL_SOCKET_BAD) ||
       (clientfd[i] != CURL_SOCKET_BAD)) {
      logmsg("[%s] ABORTING", data_or_ctrl(i));
    }
  }

  *infdp = CURL_SOCKET_BAD;
}